

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

bool __thiscall FlatZinc::AST::Node::hasAtom(Node *this,string *id)

{
  __type _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  lVar2 = __dynamic_cast(this,&typeinfo,&Array::typeinfo,0);
  if (lVar2 == 0) {
    bVar5 = false;
    lVar2 = __dynamic_cast(this,&typeinfo,&Atom::typeinfo,0);
    if (lVar2 != 0) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar2 + 8),id);
      return _Var1;
    }
  }
  else {
    lVar4 = *(long *)(lVar2 + 0x10) - *(long *)(lVar2 + 8) >> 3;
    do {
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
      if (!bVar5) {
        return bVar5;
      }
      lVar3 = *(long *)(*(long *)(lVar2 + 8) + lVar4 * 8);
    } while (((lVar3 == 0) ||
             (lVar3 = __dynamic_cast(lVar3,&typeinfo,&Atom::typeinfo,0), lVar3 == 0)) ||
            (_Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(lVar3 + 8),id), !_Var1));
  }
  return bVar5;
}

Assistant:

inline bool Node::hasAtom(const std::string& id) {
	if (auto* a = dynamic_cast<Array*>(this)) {
		for (auto i = a->a.size(); (i--) != 0;) {
			if (Atom* at = dynamic_cast<Atom*>(a->a[i])) {
				if (at->id == id) {
					return true;
				}
			}
		}
	} else if (Atom* a = dynamic_cast<Atom*>(this)) {
		return a->id == id;
	}
	return false;
}